

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray * __thiscall
QStringBuilder<QStringBuilder<QByteArray,_QByteArray>,_char>::convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QByteArray,_QByteArray>,_char> *this)

{
  char *pcVar1;
  char *__dest;
  size_t sVar2;
  char *__dest_00;
  
  pcVar1 = (char *)((this->a).a.d.size + 1 + (this->a).b.d.size);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(longlong)pcVar1,Uninitialized);
  __dest = (__return_storage_ptr__->d).ptr;
  sVar2 = (this->a).a.d.size;
  if (sVar2 != 0) {
    memcpy(__dest,(this->a).a.d.ptr,sVar2);
  }
  __dest_00 = __dest + sVar2;
  sVar2 = (this->a).b.d.size;
  if (sVar2 != 0) {
    memcpy(__dest_00,(this->a).b.d.ptr,sVar2);
  }
  __dest_00[sVar2] = this->b;
  if (pcVar1 != __dest_00 + (sVar2 - (long)__dest) + 1) {
    QByteArray::resize((longlong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }